

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkIsDfsOrdered(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_2c);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_2c) {
      return 1;
    }
    pAVar2 = Abc_NtkObj(pNtk,local_2c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1)
      {
        p = Abc_ObjFanin(pAVar2,local_30);
        iVar1 = Abc_NodeIsTravIdCurrent(p);
        if (iVar1 == 0) {
          return 0;
        }
      }
      iVar1 = Abc_NtkIsStrash(pNtk);
      if ((iVar1 != 0) && (iVar1 = Abc_AigNodeIsChoice(pAVar2), iVar1 != 0)) {
        for (_k = (Abc_Obj_t *)(pAVar2->field_5).pData; _k != (Abc_Obj_t *)0x0;
            _k = (Abc_Obj_t *)(_k->field_5).pData) {
          iVar1 = Abc_NodeIsTravIdCurrent(_k);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
      Abc_NodeSetTravIdCurrent(pAVar2);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsDfsOrdered( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // mark the CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Abc_NodeSetTravIdCurrent( pNode );
    // go through the nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // check the fanins of the node
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                return 0;
        // check the choices of the node
        if ( Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsChoice(pNode) )
            for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    return 0;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return 1;
}